

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O2

int loader_impl_load_from_file
              (plugin_manager manager,plugin p,loader_impl impl,loader_path *paths,size_t size,
              void **handle_ptr)

{
  int iVar1;
  loader_impl_interface iface;
  size_t sVar2;
  void *pvVar3;
  loader_handle module;
  loader_handle_impl handle_impl_00;
  undefined8 *puVar4;
  size_t sVar5;
  loader_handle_impl handle_impl;
  loader_path path;
  
  if (((impl != (loader_impl)0x0) &&
      (iface = (loader_impl_interface)plugin_iface(p), iface != (loader_impl_interface)0x0)) &&
     (iVar1 = loader_impl_initialize(manager,p,impl), iVar1 == 0)) {
    sVar2 = loader_impl_handle_name(manager,*paths,path);
    if (1 < sVar2) {
      pvVar3 = loader_impl_get_handle(impl,path);
      if (pvVar3 != (void *)0x0) {
        log_write_impl_va("metacall",0x37b,"loader_impl_load_from_file",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,LOG_LEVEL_ERROR,
                          "Load from file handle failed, handle with name %s already loaded",path);
        return 1;
      }
    }
    sVar2 = vector_size(impl->handle_impl_init_order);
    vector_push_back_empty(impl->handle_impl_init_order);
    module = (*iface->load_from_file)(impl,paths,size);
    if (module == (loader_handle)0x0) {
      while( true ) {
        sVar2 = sVar2 + 1;
        sVar5 = vector_size(impl->handle_impl_init_order);
        if (sVar5 <= sVar2) break;
        puVar4 = (undefined8 *)vector_at(impl->handle_impl_init_order,sVar2);
        loader_impl_destroy_handle((loader_handle_impl)*puVar4);
      }
      vector_pop_back(impl->handle_impl_init_order);
    }
    else {
      handle_impl_00 = loader_impl_load_handle(impl,iface,module,path,0x1000);
      if (handle_impl_00 != (loader_handle_impl)0x0) {
        handle_impl_00->populated = 1;
        handle_impl = handle_impl_00;
        iVar1 = set_insert(impl->handle_impl_path_map,handle_impl_00->path,handle_impl_00);
        if (iVar1 == 0) {
          iVar1 = set_insert(impl->handle_impl_map,handle_impl_00->module,handle_impl_00);
          if (iVar1 == 0) {
            iVar1 = (*iface->discover)(impl,handle_impl_00->module,handle_impl_00->ctx);
            if ((iVar1 == 0) &&
               (iVar1 = loader_impl_handle_register(manager,impl,path,handle_impl_00,handle_ptr),
               iVar1 == 0)) {
              vector_set(impl->handle_impl_init_order,sVar2,&handle_impl);
              return 0;
            }
            set_remove(impl->handle_impl_map,handle_impl_00->module);
          }
          set_remove(impl->handle_impl_path_map,handle_impl_00->path);
        }
        while( true ) {
          sVar2 = sVar2 + 1;
          sVar5 = vector_size(impl->handle_impl_init_order);
          if (sVar5 <= sVar2) break;
          puVar4 = (undefined8 *)vector_at(impl->handle_impl_init_order,sVar2);
          loader_impl_destroy_handle((loader_handle_impl)*puVar4);
        }
        vector_pop_back(impl->handle_impl_init_order);
        log_write_impl_va("metacall",0x3b5,"loader_impl_load_from_file",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,LOG_LEVEL_ERROR,"Error when loading handle: %s",path);
        loader_impl_destroy_handle(handle_impl_00);
      }
    }
  }
  return 1;
}

Assistant:

int loader_impl_load_from_file(plugin_manager manager, plugin p, loader_impl impl, const loader_path paths[], size_t size, void **handle_ptr)
{
	if (impl != NULL)
	{
		loader_impl_interface iface = loader_iface(p);

		/* TODO: Disable logs here until log is completely thread safe and async signal safe */
		/*
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			log_write("metacall", LOG_LEVEL_DEBUG, "Loading %s", paths[iterator]);
		}
		*/

		if (iface != NULL)
		{
			loader_handle handle;
			loader_path path;
			size_t init_order;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_handle_name(manager, paths[0], path) > 1 && loader_impl_get_handle(impl, path) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from file handle failed, handle with name %s already loaded", path);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			handle = iface->load_from_file(impl, paths, size);

			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader interface: %p - Loader handle: %p", (void *)iface, (void *)handle); */

			if (handle != NULL)
			{
				loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, handle, path, LOADER_PATH_SIZE);

				/* TODO: Disable logs here until log is completely thread safe and async signal safe */
				/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader handle impl: %p", (void *)handle_impl); */

				if (handle_impl != NULL)
				{
					handle_impl->populated = 1;

					if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
					{
						if (set_insert(impl->handle_impl_map, handle_impl->module, handle_impl) == 0)
						{
							if (iface->discover(impl, handle_impl->module, handle_impl->ctx) == 0)
							{
								if (loader_impl_handle_register(manager, impl, path, handle_impl, handle_ptr) == 0)
								{
									vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

									return 0;
								}
							}

							set_remove(impl->handle_impl_map, handle_impl->module);
						}

						set_remove(impl->handle_impl_path_map, handle_impl->path);
					}

					{
						size_t iterator;

						for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
						{
							loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

							loader_impl_destroy_handle(iterator_handle_impl);
						}

						vector_pop_back(impl->handle_impl_init_order);
					}

					log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", path);

					loader_impl_destroy_handle(handle_impl);
				}
			}
			else
			{
				size_t iterator;

				for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
				{
					loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

					loader_impl_destroy_handle(iterator_handle_impl);
				}

				vector_pop_back(impl->handle_impl_init_order);
			}
		}
	}

	return 1;
}